

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

void __thiscall
t_cpp_generator::generate_struct_definition
          (t_cpp_generator *this,ostream *out,ostream *force_cpp_out,t_struct *tstruct,bool setters,
          bool is_user_struct)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  iterator iVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  pointer pptVar6;
  undefined7 in_register_00000081;
  undefined3 in_register_00000089;
  key_type local_78;
  undefined4 local_58;
  undefined4 local_54;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_78,"final",(allocator *)&local_50);
  local_54 = (undefined4)CONCAT71(in_register_00000081,setters);
  local_58 = CONCAT31(in_register_00000089,is_user_struct);
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(tstruct->super_t_type).annotations_._M_t,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  if ((_Rb_tree_header *)iVar4._M_node ==
      &(tstruct->super_t_type).annotations_._M_t._M_impl.super__Rb_tree_header) {
    poVar5 = std::operator<<(force_cpp_out,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_78,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_78);
    iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var,iVar3));
    poVar5 = std::operator<<(poVar5,"::~");
    iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var_00,iVar3));
    poVar5 = std::operator<<(poVar5,"() noexcept {");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_78);
    t_generator::indent_abi_cxx11_(&local_78,(t_generator *)this);
    poVar5 = std::operator<<(force_cpp_out,(string *)&local_78);
    poVar5 = std::operator<<(poVar5,"}");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_78);
  }
  if ((char)local_54 != '\0') {
    for (pptVar6 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar6 !=
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
      bVar2 = (*pptVar6)->reference_;
      poVar5 = std::operator<<(out,(string *)&::endl_abi_cxx11_);
      if (bVar2 == true) {
        t_generator::indent_abi_cxx11_(&local_78,(t_generator *)this);
        poVar5 = std::operator<<(poVar5,(string *)&local_78);
        poVar5 = std::operator<<(poVar5,"void ");
        iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
        poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var_01,iVar3));
        poVar5 = std::operator<<(poVar5,"::__set_");
        poVar5 = std::operator<<(poVar5,(string *)&(*pptVar6)->name_);
        poVar5 = std::operator<<(poVar5,"(::std::shared_ptr<");
        type_name_abi_cxx11_(&local_50,this,(*pptVar6)->type_,false,false);
        poVar5 = std::operator<<(poVar5,(string *)&local_50);
        std::operator<<(poVar5,">");
      }
      else {
        t_generator::indent_abi_cxx11_(&local_78,(t_generator *)this);
        poVar5 = std::operator<<(poVar5,(string *)&local_78);
        poVar5 = std::operator<<(poVar5,"void ");
        iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
        poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var_02,iVar3));
        poVar5 = std::operator<<(poVar5,"::__set_");
        poVar5 = std::operator<<(poVar5,(string *)&(*pptVar6)->name_);
        poVar5 = std::operator<<(poVar5,"(");
        type_name_abi_cxx11_(&local_50,this,(*pptVar6)->type_,false,true);
        std::operator<<(poVar5,(string *)&local_50);
      }
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_78);
      poVar5 = std::operator<<(out," val) {");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      t_generator::indent_abi_cxx11_(&local_78,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)&local_78);
      poVar5 = std::operator<<(poVar5,"this->");
      poVar5 = std::operator<<(poVar5,(string *)&(*pptVar6)->name_);
      poVar5 = std::operator<<(poVar5," = val;");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_78);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      if ((*pptVar6)->req_ == T_OPTIONAL) {
        t_generator::indent_abi_cxx11_(&local_78,(t_generator *)this);
        poVar5 = std::operator<<(out,(string *)&local_78);
        t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
        poVar5 = std::operator<<(poVar5,(string *)&local_50);
        poVar5 = std::operator<<(poVar5,"__isset.");
        poVar5 = std::operator<<(poVar5,(string *)&(*pptVar6)->name_);
        poVar5 = std::operator<<(poVar5," = true;");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_78);
      }
      t_generator::indent_abi_cxx11_(&local_78,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)&local_78);
      poVar5 = std::operator<<(poVar5,"}");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_78);
    }
  }
  if ((char)local_58 != '\0') {
    generate_struct_ostream_operator(this,out,tstruct);
  }
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_cpp_generator::generate_struct_definition(ostream& out,
                                                 ostream& force_cpp_out,
                                                 t_struct* tstruct,
                                                 bool setters,
                                                 bool is_user_struct) {
  // Get members
  vector<t_field*>::const_iterator m_iter;
  const vector<t_field*>& members = tstruct->get_members();

  // Destructor
  if (tstruct->annotations_.find("final") == tstruct->annotations_.end()) {
    force_cpp_out << endl << indent() << tstruct->get_name() << "::~" << tstruct->get_name()
                  << "() noexcept {" << endl;
    indent_up();

    indent_down();
    force_cpp_out << indent() << "}" << endl << endl;
  }

  // Create a setter function for each field
  if (setters) {
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      if (is_reference((*m_iter))) {
        out << endl << indent() << "void " << tstruct->get_name() << "::__set_"
            << (*m_iter)->get_name() << "(::std::shared_ptr<"
            << type_name((*m_iter)->get_type(), false, false) << ">";
        out << " val) {" << endl;
      } else {
        out << endl << indent() << "void " << tstruct->get_name() << "::__set_"
            << (*m_iter)->get_name() << "(" << type_name((*m_iter)->get_type(), false, true);
        out << " val) {" << endl;
      }
      indent_up();
      out << indent() << "this->" << (*m_iter)->get_name() << " = val;" << endl;
      indent_down();

      // assume all fields are required except optional fields.
      // for optional fields change __isset.name to true
      bool is_optional = (*m_iter)->get_req() == t_field::T_OPTIONAL;
      if (is_optional) {
        out << indent() << indent() << "__isset." << (*m_iter)->get_name() << " = true;" << endl;
      }
      out << indent() << "}" << endl;
    }
  }
  if (is_user_struct) {
    generate_struct_ostream_operator(out, tstruct);
  }
  out << endl;
}